

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderVertexSpacing::verifyEdges
          (TessellationShaderVertexSpacing *this,_tess_edges *edges,_run *run)

{
  _tessellation_shader_vertex_spacing _Var1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  pointer p_Var6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  TestError *pTVar9;
  reference pvVar10;
  _tessellation_shader_vertex_spacing vertex_spacing;
  float fVar11;
  float fVar12;
  MessageBuilder local_ba8;
  MessageBuilder local_a28;
  MessageBuilder local_8a8;
  uint local_724;
  size_type sStack_720;
  int expected_counter;
  MessageBuilder local_718;
  int local_594;
  MessageBuilder local_590;
  MessageBuilder local_410;
  MessageBuilder local_290;
  float local_10c;
  uint local_108;
  float expected_delta;
  _tess_coordinate_delta new_item;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
  local_f0;
  _tess_coordinate_delta *local_e8;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
  local_e0;
  _tess_coordinate_deltas_iterator deltas_iterator;
  float distance;
  float distance_nonsqrt;
  _tess_coordinate_cartesian *point_b;
  _tess_coordinate_cartesian *point_a;
  uint n_base_point;
  undefined1 local_b0 [4];
  uint n_points;
  _tess_coordinate_deltas segment_deltas;
  float local_90;
  float outermost_edge_tess_level_clamped_rounded;
  float edge_clamped_rounded_tess_level;
  float edge_clamped_tess_level;
  _tess_edge *edge;
  __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
  local_78;
  _tess_edges_const_iterator edges_iterator;
  uint n_edge;
  undefined1 local_60 [8];
  string vertex_spacing_string;
  string primitive_mode_string;
  _run *run_local;
  _tess_edges *edges_local;
  TessellationShaderVertexSpacing *this_local;
  
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)((long)&vertex_spacing_string.field_2 + 8),
             (TessellationShaderUtils *)(ulong)run->primitive_mode,(_tessellation_primitive_mode)run
            );
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            ((string *)local_60,(TessellationShaderUtils *)(ulong)run->vertex_spacing,vertex_spacing
            );
  edges_iterator._M_current._0_4_ = 0;
  local_78._M_current =
       (_tess_edge *)
       std::
       vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
       ::begin(edges);
  do {
    edge = (_tess_edge *)
           std::
           vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
           ::end(edges);
    bVar2 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
                        *)&edge);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(vertex_spacing_string.field_2._M_local_buf + 8));
      return;
    }
    _edge_clamped_rounded_tess_level =
         __gnu_cxx::
         __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
         ::operator*(&local_78);
    outermost_edge_tess_level_clamped_rounded = 0.0;
    local_90 = 0.0;
    segment_deltas.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ::vector((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
              *)local_b0);
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (run->vertex_spacing,_edge_clamped_rounded_tess_level->outermost_tess_level,
               this->m_gl_max_tess_gen_level_value,(float *)0x0,
               (float *)((long)&segment_deltas.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (run->vertex_spacing,_edge_clamped_rounded_tess_level->tess_level,
               this->m_gl_max_tess_gen_level_value,&outermost_edge_tess_level_clamped_rounded,
               &local_90);
    sVar3 = std::
            vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            ::size(&_edge_clamped_rounded_tess_level->points);
    if (1 < (uint)sVar3) {
      for (point_a._4_4_ = 0; point_a._4_4_ < (uint)sVar3 - 1; point_a._4_4_ = point_a._4_4_ + 1) {
        pvVar4 = std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::operator[](&_edge_clamped_rounded_tess_level->points,(ulong)point_a._4_4_);
        pvVar5 = std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::operator[](&_edge_clamped_rounded_tess_level->points,(ulong)(point_a._4_4_ + 1));
        deltas_iterator._M_current._0_4_ = 0.0;
        fVar11 = pvVar4->x - pvVar5->x;
        fVar12 = pvVar4->y - pvVar5->y;
        deltas_iterator._M_current._4_4_ = fVar11 * fVar11 + fVar12 * fVar12;
        deltas_iterator._M_current._0_4_ = ::deFloatSqrt(deltas_iterator._M_current._4_4_);
        __gnu_cxx::
        __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
        ::__normal_iterator(&local_e0);
        local_e8 = (_tess_coordinate_delta *)
                   std::
                   vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                   ::begin((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                            *)local_b0);
        local_e0._M_current = local_e8;
        while( true ) {
          local_f0._M_current =
               (_tess_coordinate_delta *)
               std::
               vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
               ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      *)local_b0);
          bVar2 = __gnu_cxx::operator!=(&local_e0,&local_f0);
          if (!bVar2) break;
          p_Var6 = __gnu_cxx::
                   __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
                   ::operator->(&local_e0);
          fVar11 = de::abs<float>(p_Var6->delta - deltas_iterator._M_current._0_4_);
          if (fVar11 < 0.001) {
            p_Var6 = __gnu_cxx::
                     __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
                     ::operator->(&local_e0);
            p_Var6->counter = p_Var6->counter + 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
          ::operator++(&local_e0,0);
        }
        new_item = (_tess_coordinate_delta)
                   std::
                   vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                   ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                          *)local_b0);
        bVar2 = __gnu_cxx::operator==
                          (&local_e0,
                           (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>_>
                            *)&new_item);
        if (bVar2) {
          _tess_coordinate_delta::_tess_coordinate_delta
                    ((_tess_coordinate_delta *)&stack0xfffffffffffffef8);
          local_108 = 1;
          expected_delta = deltas_iterator._M_current._0_4_;
          std::
          vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
          ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                       *)local_b0,(value_type *)&stack0xfffffffffffffef8);
        }
      }
      _Var1 = run->vertex_spacing;
      if (_Var1 != TESSELLATION_SHADER_VERTEX_SPACING_EQUAL) {
        if (_Var1 - TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN < 2) {
          sVar3 = std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ::size((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                          *)local_b0);
          if (2 < sVar3) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_718,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_718,(char (*) [31])"More than two segment deltas (");
            sStack_720 = std::
                         vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                         ::size((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                 *)local_b0);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stack0xfffffffffffff8e0);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [79])
                                       ") were generated for the following tessellation configuration: primitive mode:"
                               );
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&vertex_spacing_string.field_2 + 8));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_60);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [29])"inner tessellation levels: (");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [32])"), outer tessellation levels: (");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_718);
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,
                       "Fractional spacing mode tessellated edges to segments of more than two differentiable lengths"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x4fc);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          sVar3 = std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ::size((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                          *)local_b0);
          if (sVar3 == 1) {
            if (run->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
              local_724 = (int)segment_deltas.
                               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                          ((uint)edges_iterator._M_current / 3) * -2;
            }
            else {
              local_724 = (uint)local_90;
              if ((run->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) &&
                 (run->vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD)) {
                local_724 = (int)local_90 + ((uint)edges_iterator._M_current >> 2) * -2;
              }
              if (_edge_clamped_rounded_tess_level->tess_level <= 0.0) {
                local_724 = 1;
              }
            }
            pvVar10 = std::
                      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                    *)local_b0,0);
            if (pvVar10->counter != local_724) {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_8a8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_8a8,(char (*) [38])"Invalid amount of segments (expected:")
              ;
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&local_724);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])", found: ");
              pvVar10 = std::
                        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                        ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                      *)local_b0,0);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->counter);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [78])
                                         ") was generated for the following tessellation configuration: primitive mode:"
                                 );
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&vertex_spacing_string.field_2 + 8));
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_60);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [29])"inner tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [32])"), outer tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_8a8);
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,
                         "Invalid amount of segments generated for fractional vertex spacing mode",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x528);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          else {
            pvVar10 = std::
                      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                    *)local_b0,0);
            if (((pvVar10->counter != 2) ||
                (pvVar10 = std::
                           vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                           ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                         *)local_b0,1), pvVar10->counter != (int)(long)local_90 - 2U
                )) && ((pvVar10 = std::
                                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                  ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                                *)local_b0,1), pvVar10->counter != 2 ||
                       (pvVar10 = std::
                                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                  ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                                *)local_b0,0),
                       pvVar10->counter != (int)(long)local_90 - 2U)))) {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_a28,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_a28,
                                  (char (*) [51])
                                  "Invalid number of segments with different deltas (");
              pvVar10 = std::
                        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                        ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                      *)local_b0,0);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->delta);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])0x2b82e30);
              pvVar10 = std::
                        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                        ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                      *)local_b0,1);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->delta);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [33])") was generated. primitive mode:");
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&vertex_spacing_string.field_2 + 8));
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_60);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [29])"inner tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [32])"), outer tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_a28);
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,
                         "Equal amount of segments was generated for segments of different deltas",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x53f);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            pvVar10 = std::
                      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                    *)local_b0,0);
            if ((pvVar10->counter != 2) &&
               (pvVar10 = std::
                          vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                          ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                        *)local_b0,1), pvVar10->counter != 2)) {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_ba8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_ba8,
                                  (char (*) [95])
                                  "Neither of the segments generated by the tessellator was defined exactly twice.primitive mode:"
                                 );
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&vertex_spacing_string.field_2 + 8));
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_60);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [29])"inner tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [32])"), outer tessellation levels: (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_ba8);
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,
                         "Neither of the generated segments was repeated exactly twice for fractional vertex spacing mode"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x550);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          goto LAB_015486a2;
        }
        if (_Var1 != TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Unrecognized vertex spacing mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x559);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      local_10c = _edge_clamped_rounded_tess_level->edge_length / local_90;
      sVar3 = std::
              vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
              ::size((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      *)local_b0);
      if (sVar3 != 1) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_290,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_290,
                            (char (*) [104])
                            "More than one segment delta was generated for the following tessellation configuration: primitive mode:"
                           );
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&vertex_spacing_string.field_2 + 8));
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_60);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [29])"inner tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [32])"), outer tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_290);
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Equal vertex spacing mode tessellation generated segment edges of varying lengths, whereas only one was expected."
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                   ,0x4b2);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pvVar10 = std::
                vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                              *)local_b0,0);
      fVar11 = de::abs<float>(pvVar10->delta - local_10c);
      if (0.001 < fVar11) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_410,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_410,(char (*) [33])"Invalid segment delta (expected:");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_10c);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])", found: ");
        pvVar10 = std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                *)local_b0,0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->delta);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [78])
                                   ") was generated for the following tessellation configuration: primitive mode:"
                           );
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&vertex_spacing_string.field_2 + 8));
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_60);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [29])"inner tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [32])"), outer tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_410);
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Invalid delta between segments generated by the tessellator configured to run in equal vertex spacing mode"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                   ,0x4c3);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pvVar10 = std::
                vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                              *)local_b0,0);
      if (pvVar10->counter != (uint)(long)local_90) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_590,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_590,(char (*) [38])"Invalid amount of segments (expected:");
        local_594 = (int)local_90;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_594);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])", found: ");
        pvVar10 = std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ::operator[]((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                *)local_b0,0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvVar10->counter);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [78])
                                   ") was generated for the following tessellation configuration: primitive mode:"
                           );
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&vertex_spacing_string.field_2 + 8));
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2b20c67);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_60);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [29])"inner tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->inner + 1);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [32])"), outer tessellation levels: (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 2);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,run->outer + 3);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_590);
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"Invalid amount of segments generated for equal vertex spacing mode",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                   ,0x4d5);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
LAB_015486a2:
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ::~vector((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
               *)local_b0);
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_edge_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>_>
    ::operator++(&local_78,0);
    edges_iterator._M_current._0_4_ = (uint)edges_iterator._M_current + 1;
  } while( true );
}

Assistant:

void TessellationShaderVertexSpacing::verifyEdges(const _tess_edges& edges, const _run& run)
{
	/* Cache strings that may be used by logging the routines */
	const std::string primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
	const std::string vertex_spacing_string =
		TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

	/* Iterate through all edges */
	unsigned int n_edge = 0;

	for (_tess_edges_const_iterator edges_iterator = edges.begin(); edges_iterator != edges.end();
		 edges_iterator++, n_edge++)
	{
		const _tess_edge&		edge									  = *edges_iterator;
		float					edge_clamped_tess_level					  = 0.0f;
		float					edge_clamped_rounded_tess_level			  = 0.0f;
		float					outermost_edge_tess_level_clamped_rounded = 0.0f;
		_tess_coordinate_deltas segment_deltas;

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.outermost_tess_level, m_gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outermost_edge_tess_level_clamped_rounded);

		/* Retrieve amount of segments the edge should consist of */
		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.tess_level, m_gl_max_tess_gen_level_value, &edge_clamped_tess_level,
			&edge_clamped_rounded_tess_level);

		/* Take two subsequent points if they are available. Vertex spacing has no meaning
		 * in a world of degenerate edges, so skip the check if we have just encountered one.
		 */
		const unsigned int n_points = (const unsigned int)edge.points.size();

		if (n_points < 2)
		{
			continue;
		}

		/* Compute segment deltas */
		for (unsigned int n_base_point = 0; n_base_point < n_points - 1; n_base_point++)
		{
			const _tess_coordinate_cartesian& point_a = edge.points[n_base_point + 0];
			const _tess_coordinate_cartesian& point_b = edge.points[n_base_point + 1];

			/* Calculate the distance between the points */
			float distance_nonsqrt = 0.0f;
			float distance		   = 0.0f;

			distance_nonsqrt =
				(point_a.x - point_b.x) * (point_a.x - point_b.x) + (point_a.y - point_b.y) * (point_a.y - point_b.y);

			distance = deFloatSqrt(distance_nonsqrt);

			/* Check if the distance is not already recognized. */
			_tess_coordinate_deltas_iterator deltas_iterator;

			for (deltas_iterator = segment_deltas.begin(); deltas_iterator != segment_deltas.end(); deltas_iterator++)
			{
				if (de::abs(deltas_iterator->delta - distance) < epsilon)
				{
					/* Increment the counter and leave */
					deltas_iterator->counter++;

					break;
				}
			}

			if (deltas_iterator == segment_deltas.end())
			{
				/* This is the first time we're encountering a segment of this specific length. */
				_tess_coordinate_delta new_item;

				new_item.counter = 1;
				new_item.delta   = distance;

				segment_deltas.push_back(new_item);
			}
		} /* for (all base points) */

		DE_ASSERT(segment_deltas.size() != 0);

		switch (run.vertex_spacing)
		{
		case TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT:
		case TESSELLATION_SHADER_VERTEX_SPACING_EQUAL:
		{
			/* For equal vertex spacings, we should end up with a single _tess_coordinate_delta instance
			 * of a predefined length, describing exactly edge_clamped_rounded_tess_level invocations */
			float expected_delta = edge.edge_length / edge_clamped_rounded_tess_level;

			if (segment_deltas.size() != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "More than one segment delta was generated for the following tessellation"
									  " configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Equal vertex spacing mode tessellation generated segment edges of varying lengths, "
						 "whereas only one was expected.");
			}

			if (de::abs(segment_deltas[0].delta - expected_delta) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid segment delta (expected:" << expected_delta
								   << ", found: " << segment_deltas[0].delta
								   << ") was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid delta between segments generated by the tessellator configured to run "
						 "in equal vertex spacing mode");
			}

			if (segment_deltas[0].counter != (unsigned int)edge_clamped_rounded_tess_level)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Invalid amount of segments (expected:" << (int)edge_clamped_rounded_tess_level
								   << ", found: " << segment_deltas[0].counter
								   << ") "
									  "was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid amount of segments generated for equal vertex spacing mode");
			}

			break;
		} /* default/equal vertex spacing */

		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN:
		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD:
		{
			/* For fractional vertex spacings, situation is more tricky. The extension specification
			 * is very liberal when it comes to defining segment lengths. Hence the only thing we
			 * should be testing here is that:
			 *
			 * a) No more than 2 deltas are generated for a single edge.
			 *
			 * b) If a single delta is generated, it should:
			 *
			 *    1. define exactly edge_clamped_rounded_tess_level-2 segments if
			 *    |edge_clamped_rounded_tess_level - edge_clamped_tess_level| == 2.0f,
			 *
			 *    2. define exactly edge_clamped_rounded_tess_level segments otherwise.
			 *
			 * c) If two deltas are generated, one of them should define 2 segments, and the other
			 *    one should define edge_clamped_rounded_tess_level-2 segments.
			 */

			if (segment_deltas.size() > 2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "More than two segment deltas (" << segment_deltas.size()
								   << ") were generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Fractional spacing mode tessellated edges to segments of more than two "
						 "differentiable lengths");
			}

			if (segment_deltas.size() == 1)
			{
				int expected_counter = 0;

				if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					/* With each triangle level, 2 segments go out. Each triangle consists of 3 edges */
					expected_counter = (int)outermost_edge_tess_level_clamped_rounded - 2 * (n_edge / 3);
				}
				else
				{
					expected_counter = (int)edge_clamped_rounded_tess_level;
					if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS &&
						run.vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD)
					{
						/* 8 edges expected in total; we should expect 2 segments less for the inner quad */
						expected_counter = (int)edge_clamped_rounded_tess_level - 2 * (n_edge / 4);
					}

					/* For degenerate cases, always assume exactly one segment should be generated */
					if (edge.tess_level <= 0.0f)
					{
						expected_counter = 1;
					}
				}

				if (segment_deltas[0].counter != (unsigned int)expected_counter)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid amount of segments (expected:" << expected_counter
									   << ", found: " << segment_deltas[0].counter
									   << ") "
										  "was generated for the following tessellation configuration: "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid amount of segments generated for fractional vertex spacing mode");
				}
			}
			else
			{
				DE_ASSERT(segment_deltas.size() == 2);

				if (!((segment_deltas[0].counter == 2 &&
					   segment_deltas[1].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2)) ||
					  (segment_deltas[1].counter == 2 &&
					   segment_deltas[0].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2))))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of segments with different deltas ("
									   << segment_deltas[0].delta << " and " << segment_deltas[1].delta
									   << ") was generated. "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Equal amount of segments was generated for segments of different deltas");
				}

				if (segment_deltas[0].counter != 2 && segment_deltas[1].counter != 2)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Neither of the segments generated by the tessellator was defined "
										  "exactly twice."
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Neither of the generated segments was repeated exactly twice "
							 "for fractional vertex spacing mode");
				}
			}

			break;
		} /* fractional even/odd vertex spacing types */

		default:
		{
			TCU_FAIL("Unrecognized vertex spacing mode");
		}
		} /* switch (run.vertex_spacing) */
	}	 /* for (all edges) */
}